

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::anon_unknown_18::jacobiRotateRight<float>
               (Matrix44<float> *A,int j,int k,float c,float s)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  int in_EDX;
  int in_ESI;
  Matrix44<float> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float tau2;
  float tau1;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pfVar3 = Matrix44<float>::operator[](in_RDI,local_1c);
    fVar1 = pfVar3[in_ESI];
    pfVar3 = Matrix44<float>::operator[](in_RDI,local_1c);
    fVar2 = pfVar3[in_EDX];
    pfVar3 = Matrix44<float>::operator[](in_RDI,local_1c);
    pfVar3[in_ESI] = in_XMM0_Da * fVar1 + -(in_XMM1_Da * fVar2);
    pfVar3 = Matrix44<float>::operator[](in_RDI,local_1c);
    pfVar3[in_EDX] = in_XMM1_Da * fVar1 + in_XMM0_Da * fVar2;
  }
  return;
}

Assistant:

void
jacobiRotateRight (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                   const int j,
                   const int k,
                   const T c,
                   const T s)
{
    for (int i = 0; i < 4; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j] = c * tau1 - s * tau2;
        A[i][k] = s * tau1 + c * tau2;
    }
}